

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O0

UText * utf8TextClone(UText *dest,UText *src,UBool deep,UErrorCode *status)

{
  UBool UVar1;
  UText *pUVar2;
  int64_t iVar3;
  void *__dest;
  char *copyStr;
  int32_t len;
  UErrorCode *status_local;
  UBool deep_local;
  UText *src_local;
  UText *dest_local;
  
  pUVar2 = shallowTextClone(dest,src,status);
  if ((deep != '\0') && (UVar1 = U_SUCCESS(*status), UVar1 != '\0')) {
    iVar3 = utext_nativeLength_63(src);
    __dest = uprv_malloc_63((long)((int)iVar3 + 1));
    if (__dest == (void *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      memcpy(__dest,src->context,(long)((int)iVar3 + 1));
      pUVar2->context = __dest;
      pUVar2->providerProperties = pUVar2->providerProperties | 0x20;
    }
  }
  return pUVar2;
}

Assistant:

static UText * U_CALLCONV
utf8TextClone(UText *dest, const UText *src, UBool deep, UErrorCode *status)
{
    // First do a generic shallow clone.  Does everything needed for the UText struct itself.
    dest = shallowTextClone(dest, src, status);

    // For deep clones, make a copy of the string.
    //  The copied storage is owned by the newly created clone.
    //
    // TODO:  There is an isssue with using utext_nativeLength().
    //        That function is non-const in cases where the input was NUL terminated
    //          and the length has not yet been determined.
    //        This function (clone()) is const.
    //        There potentially a thread safety issue lurking here.
    //
    if (deep && U_SUCCESS(*status)) {
        int32_t  len = (int32_t)utext_nativeLength((UText *)src);
        char *copyStr = (char *)uprv_malloc(len+1);
        if (copyStr == NULL) {
            *status = U_MEMORY_ALLOCATION_ERROR;
        } else {
            uprv_memcpy(copyStr, src->context, len+1);
            dest->context = copyStr;
            dest->providerProperties |= I32_FLAG(UTEXT_PROVIDER_OWNS_TEXT);
        }
    }
    return dest;
}